

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall gl3cts::TransformFeedback::APIErrors::testInstanced(APIErrors *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestContext *pTVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  undefined4 *puVar10;
  MessageBuilder local_1160;
  MessageBuilder local_fe0;
  MessageBuilder local_e60;
  undefined8 local_ce0;
  GLvoid *pointer;
  undefined1 local_cd0 [4];
  GLint location;
  short local_b4a;
  undefined1 local_b48 [6];
  unsigned_short invalid_name;
  int local_9c8;
  int local_9c4;
  GLint more_than_max_vertex_streams;
  GLint max_vertex_streams;
  MessageBuilder local_840;
  MessageBuilder local_6c0;
  MessageBuilder local_540;
  MessageBuilder local_3c0;
  undefined4 local_23c;
  MessageBuilder local_238;
  _Self local_b8 [3];
  key_type local_9c;
  _Self local_98;
  key_type local_8c;
  undefined1 local_88 [4];
  int mode;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> supported_mode;
  GLenum _supported_mode [12];
  Functions *gl;
  APIErrors *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext(this->m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  memcpy(&supported_mode._M_t._M_impl.super__Rb_tree_header._M_node_count,&DAT_029a6180,0x30);
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::set<unsigned_int*>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)local_88,
             (uint *)&supported_mode._M_t._M_impl.super__Rb_tree_header._M_node_count,
             _supported_mode + 10);
  local_8c = 0;
  while( true ) {
    local_9c = local_8c;
    local_98._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    local_88,&local_9c);
    local_b8[0]._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    local_88);
    bVar1 = std::operator!=(&local_98,local_b8);
    if (!bVar1) break;
    local_8c = local_8c + 1;
  }
  (**(code **)(lVar6 + 0x5b8))(local_8c,this->m_transform_feedback_object_0,1);
  iVar3 = (**(code **)(lVar6 + 0x800))();
  if (iVar3 == 0x500) {
    (**(code **)(lVar6 + 0x5c8))(local_8c,this->m_transform_feedback_object_0,0,1);
    iVar3 = (**(code **)(lVar6 + 0x800))();
    if (iVar3 == 0x500) {
      (**(code **)(lVar6 + 0xd0))(0x8e22,this->m_transform_feedback_object_0);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glBindTransformFeedback call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x586);
      (**(code **)(lVar6 + 0x1680))(this->m_program_id_with_geometry_shader);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glUseProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x58a);
      (**(code **)(lVar6 + 0xd8))(this->m_vertex_array_object);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glBindVertexArray call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x58e);
      (**(code **)(lVar6 + 0x48))(0x8c8e,0,this->m_buffer_0);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glBindBuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x592);
      (**(code **)(lVar6 + 0x30))(0);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glBeginTransformFeedback call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x596);
      (**(code **)(lVar6 + 0x538))(0,0,1);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glDrawArrays call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x59a);
      (**(code **)(lVar6 + 0x638))();
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glEndTransformFeedback call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x59e);
      (**(code **)(lVar6 + 0x5b8))(1,this->m_transform_feedback_object_0);
      iVar3 = (**(code **)(lVar6 + 0x800))();
      if (iVar3 == 0x502) {
        (**(code **)(lVar6 + 0x5c8))(1,this->m_transform_feedback_object_0,0);
        iVar3 = (**(code **)(lVar6 + 0x800))();
        if (iVar3 == 0x502) {
          (**(code **)(lVar6 + 0xd0))(0x8e22,this->m_transform_feedback_object_0);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glBindTransformFeedback call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5bb);
          (**(code **)(lVar6 + 0x1680))(this->m_program_id_with_tessellation_shaders);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glUseProgram call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5bf);
          (**(code **)(lVar6 + 0xd8))(this->m_vertex_array_object);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glBindVertexArray call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5c3);
          (**(code **)(lVar6 + 0x48))(0x8c8e,0,this->m_buffer_0);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glBindBuffer call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5c7);
          (**(code **)(lVar6 + 0x30))(1);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glBeginTransformFeedback call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5cb);
          (**(code **)(lVar6 + 0x538))(0xe,0,2);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glDrawArrays call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5cf);
          (**(code **)(lVar6 + 0x638))();
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glEndTransformFeedback call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5d3);
          (**(code **)(lVar6 + 0x5b8))(0,this->m_transform_feedback_object_0,1);
          iVar3 = (**(code **)(lVar6 + 0x800))();
          if (iVar3 == 0x502) {
            (**(code **)(lVar6 + 0x5c8))(0,this->m_transform_feedback_object_0,0,1);
            iVar3 = (**(code **)(lVar6 + 0x800))();
            if (iVar3 == 0x502) {
              local_9c4 = 0;
              (**(code **)(lVar6 + 0x868))(0x8e71,&local_9c4);
              dVar4 = (**(code **)(lVar6 + 0x800))();
              glu::checkError(dVar4,"glGetIntegerv call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                              ,0x5f2);
              if (local_9c4 == 0) {
                puVar10 = (undefined4 *)__cxa_allocate_exception(4);
                *puVar10 = 0;
                __cxa_throw(puVar10,&int::typeinfo,0);
              }
              local_9c8 = local_9c4 + 1;
              (**(code **)(lVar6 + 0x5c8))(0xe,this->m_transform_feedback_object_0,local_9c8,1);
              iVar3 = (**(code **)(lVar6 + 0x800))();
              if (iVar3 == 0x501) {
                local_b4a = 1;
                while (cVar2 = (**(code **)(lVar6 + 0xcd0))(local_b4a), cVar2 != '\0') {
                  local_b4a = local_b4a + 1;
                  if (local_b4a == -1) {
                    pTVar7 = deqp::Context::getTestContext(this->m_context);
                    pTVar8 = tcu::TestContext::getLog(pTVar7);
                    tcu::TestLog::operator<<
                              ((MessageBuilder *)local_cd0,pTVar8,
                               (BeginMessageToken *)&tcu::TestLog::Message);
                    pMVar9 = tcu::MessageBuilder::operator<<
                                       ((MessageBuilder *)local_cd0,
                                        (char (*) [46])
                                        "Cannot find unused trnasform feedback object.");
                    tcu::MessageBuilder::operator<<
                              (pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
                    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_cd0);
                    puVar10 = (undefined4 *)__cxa_allocate_exception(4);
                    *puVar10 = 0;
                    __cxa_throw(puVar10,&int::typeinfo,0);
                  }
                }
                (**(code **)(lVar6 + 0x5b8))(0xe,local_b4a,1);
                iVar3 = (**(code **)(lVar6 + 0x800))();
                if (iVar3 == 0x501) {
                  (**(code **)(lVar6 + 0x5c8))(0xe,local_b4a,0,1);
                  iVar3 = (**(code **)(lVar6 + 0x800))();
                  if (iVar3 == 0x501) {
                    (**(code **)(lVar6 + 0xd0))(0x8e22,this->m_transform_feedback_object_0);
                    dVar4 = (**(code **)(lVar6 + 0x800))();
                    glu::checkError(dVar4,"glBindTransformFeedback call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x633);
                    (**(code **)(lVar6 + 0x1680))(this->m_program_id_with_input_output);
                    dVar4 = (**(code **)(lVar6 + 0x800))();
                    glu::checkError(dVar4,"glUseProgram call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x637);
                    (**(code **)(lVar6 + 0xd8))(this->m_vertex_array_object);
                    dVar4 = (**(code **)(lVar6 + 0x800))();
                    glu::checkError(dVar4,"glBindVertexArray call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x63b);
                    (**(code **)(lVar6 + 0x40))(0x8892,this->m_buffer_1);
                    dVar4 = (**(code **)(lVar6 + 0x800))();
                    glu::checkError(dVar4,"glBindBuffer call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x63f);
                    pointer._4_4_ =
                         (**(code **)(lVar6 + 0x780))
                                   (this->m_program_id_with_input_output,"v_input");
                    dVar4 = (**(code **)(lVar6 + 0x800))();
                    glu::checkError(dVar4,"glGetAttribLocation call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x643);
                    if (pointer._4_4_ < 0) {
                      puVar10 = (undefined4 *)__cxa_allocate_exception(4);
                      *puVar10 = 0;
                      __cxa_throw(puVar10,&int::typeinfo,0);
                    }
                    (**(code **)(lVar6 + 0x19f0))(pointer._4_4_,1,0x1406,0,0,0);
                    dVar4 = (**(code **)(lVar6 + 0x800))();
                    glu::checkError(dVar4,"glVertexAttribLPointer call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x64c);
                    (**(code **)(lVar6 + 0x610))(0);
                    dVar4 = (**(code **)(lVar6 + 0x800))();
                    glu::checkError(dVar4,"glEnableVertexAttribArray call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x650);
                    (**(code **)(lVar6 + 0x48))(0x8c8e,0,this->m_buffer_0);
                    dVar4 = (**(code **)(lVar6 + 0x800))();
                    glu::checkError(dVar4,"glBindBufferBase call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x654);
                    (**(code **)(lVar6 + 0x30))(0);
                    dVar4 = (**(code **)(lVar6 + 0x800))();
                    glu::checkError(dVar4,"glBeginTransformFeedback call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x658);
                    (**(code **)(lVar6 + 0x538))(0,0,1);
                    dVar4 = (**(code **)(lVar6 + 0x800))();
                    glu::checkError(dVar4,"glDrawArrays call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x65c);
                    (**(code **)(lVar6 + 0x638))();
                    dVar4 = (**(code **)(lVar6 + 0x800))();
                    glu::checkError(dVar4,"glEndTransformFeedback call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x660);
                    local_ce0 = (**(code **)(lVar6 + 0xcf8))(0x8892,0x88ba);
                    dVar4 = (**(code **)(lVar6 + 0x800))();
                    glu::checkError(dVar4,"glMapBuffer call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x664);
                    (**(code **)(lVar6 + 0x5b8))(0,this->m_transform_feedback_object_0,1);
                    iVar3 = (**(code **)(lVar6 + 0x800))();
                    if (iVar3 == 0x502) {
                      (**(code **)(lVar6 + 0x5c8))(0,this->m_transform_feedback_object_0,0,1);
                      iVar3 = (**(code **)(lVar6 + 0x800))();
                      if (iVar3 == 0x502) {
                        (**(code **)(lVar6 + 0x1670))(0x8892);
                        dVar4 = (**(code **)(lVar6 + 0x800))();
                        glu::checkError(dVar4,"glUnmapBuffer call failed.",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                        ,0x688);
                        local_ce0 = 0;
                        (**(code **)(lVar6 + 0x518))(pointer._4_4_);
                        dVar4 = (**(code **)(lVar6 + 0x800))();
                        glu::checkError(dVar4,"glDisableVertexAttribArray call failed.",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                        ,0x68e);
                        (**(code **)(lVar6 + 0xd0))(0x8e22,this->m_transform_feedback_object_1);
                        dVar4 = (**(code **)(lVar6 + 0x800))();
                        glu::checkError(dVar4,"glBindTransformFeedback call failed.",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                        ,0x696);
                        (**(code **)(lVar6 + 0x5c8))(0xe,this->m_transform_feedback_object_1,0,1);
                        iVar3 = (**(code **)(lVar6 + 0x800))();
                        if (iVar3 == 0x502) {
                          this_local._7_1_ = true;
                        }
                        else {
                          pTVar7 = deqp::Context::getTestContext(this->m_context);
                          pTVar8 = tcu::TestContext::getLog(pTVar7);
                          tcu::TestLog::operator<<
                                    (&local_1160,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message)
                          ;
                          pMVar9 = tcu::MessageBuilder::operator<<
                                             (&local_1160,
                                              (char (*) [152])
                                              "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
                                             );
                          tcu::MessageBuilder::operator<<
                                    (pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
                          tcu::MessageBuilder::~MessageBuilder(&local_1160);
                          (**(code **)(lVar6 + 0x1670))(0x8c8e);
                          (**(code **)(lVar6 + 0x518))(pointer._4_4_);
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        pTVar7 = deqp::Context::getTestContext(this->m_context);
                        pTVar8 = tcu::TestContext::getLog(pTVar7);
                        tcu::TestLog::operator<<
                                  (&local_fe0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
                        pMVar9 = tcu::MessageBuilder::operator<<
                                           (&local_fe0,
                                            (char (*) [152])
                                            "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
                                           );
                        tcu::MessageBuilder::operator<<
                                  (pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
                        tcu::MessageBuilder::~MessageBuilder(&local_fe0);
                        (**(code **)(lVar6 + 0x1670))(0x8c8e);
                        (**(code **)(lVar6 + 0x518))(pointer._4_4_);
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      pTVar7 = deqp::Context::getTestContext(this->m_context);
                      pTVar8 = tcu::TestContext::getLog(pTVar7);
                      tcu::TestLog::operator<<
                                (&local_e60,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
                      pMVar9 = tcu::MessageBuilder::operator<<
                                         (&local_e60,
                                          (char (*) [152])
                                          "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
                                         );
                      tcu::MessageBuilder::operator<<
                                (pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
                      tcu::MessageBuilder::~MessageBuilder(&local_e60);
                      (**(code **)(lVar6 + 0x1670))(0x8c8e);
                      (**(code **)(lVar6 + 0x518))(pointer._4_4_);
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    (**(code **)(lVar6 + 0x638))();
                    this_local._7_1_ = false;
                  }
                }
                else {
                  (**(code **)(lVar6 + 0x638))();
                  this_local._7_1_ = false;
                }
              }
              else {
                pTVar7 = deqp::Context::getTestContext(this->m_context);
                pTVar8 = tcu::TestContext::getLog(pTVar7);
                tcu::TestLog::operator<<
                          ((MessageBuilder *)local_b48,pTVar8,
                           (BeginMessageToken *)&tcu::TestLog::Message);
                pMVar9 = tcu::MessageBuilder::operator<<
                                   ((MessageBuilder *)local_b48,
                                    (char (*) [152])
                                    "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
                                   );
                tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_b48);
                this_local._7_1_ = false;
              }
            }
            else {
              pTVar7 = deqp::Context::getTestContext(this->m_context);
              pTVar8 = tcu::TestContext::getLog(pTVar7);
              tcu::TestLog::operator<<
                        ((MessageBuilder *)&more_than_max_vertex_streams,pTVar8,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar9 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)&more_than_max_vertex_streams,
                                  (char (*) [152])
                                  "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
                                 );
              tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&more_than_max_vertex_streams);
              this_local._7_1_ = false;
            }
          }
          else {
            pTVar7 = deqp::Context::getTestContext(this->m_context);
            pTVar8 = tcu::TestContext::getLog(pTVar7);
            tcu::TestLog::operator<<(&local_840,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar9 = tcu::MessageBuilder::operator<<
                               (&local_840,
                                (char (*) [152])
                                "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
                               );
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_840);
            this_local._7_1_ = false;
          }
        }
        else {
          pTVar7 = deqp::Context::getTestContext(this->m_context);
          pTVar8 = tcu::TestContext::getLog(pTVar7);
          tcu::TestLog::operator<<(&local_6c0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_6c0,
                              (char (*) [152])
                              "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
                             );
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_6c0);
          this_local._7_1_ = false;
        }
      }
      else {
        pTVar7 = deqp::Context::getTestContext(this->m_context);
        pTVar8 = tcu::TestContext::getLog(pTVar7);
        tcu::TestLog::operator<<(&local_540,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_540,
                            (char (*) [152])
                            "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
                           );
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_540);
        this_local._7_1_ = false;
      }
    }
    else {
      pTVar7 = deqp::Context::getTestContext(this->m_context);
      pTVar8 = tcu::TestContext::getLog(pTVar7);
      tcu::TestLog::operator<<(&local_3c0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_3c0,
                          (char (*) [131])
                          "INVALID_ENUM was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced when <mode> was invalid."
                         );
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3c0);
      this_local._7_1_ = false;
    }
  }
  else {
    pTVar7 = deqp::Context::getTestContext(this->m_context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    tcu::TestLog::operator<<(&local_238,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_238,
                        (char (*) [131])
                        "INVALID_ENUM was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced when <mode> was invalid."
                       );
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_238);
    this_local._7_1_ = false;
  }
  local_23c = 1;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_88);
  return this_local._7_1_;
}

Assistant:

bool gl3cts::TransformFeedback::APIErrors::testInstanced(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/*  INVALID_ENUM is generated by DrawTransformFeedbackInstanced and
	 DrawTransformFeedbackStreamInstanced if <mode> is invalid */

	glw::GLenum _supported_mode[] = { GL_POINTS,
									  GL_LINE_STRIP,
									  GL_LINE_LOOP,
									  GL_LINES,
									  GL_LINE_STRIP_ADJACENCY,
									  GL_LINES_ADJACENCY,
									  GL_TRIANGLE_STRIP,
									  GL_TRIANGLE_FAN,
									  GL_TRIANGLES,
									  GL_TRIANGLE_STRIP_ADJACENCY,
									  GL_TRIANGLES_ADJACENCY,
									  GL_PATCHES };

	std::set<glw::GLenum> supported_mode(_supported_mode,
										 _supported_mode + sizeof(_supported_mode) / sizeof(_supported_mode[0]));

	int mode = 0;

	while (supported_mode.find(mode) != supported_mode.end())
	{
		mode++;
	}

	gl.drawTransformFeedbackInstanced(mode, m_transform_feedback_object_0, 1);

	if (GL_INVALID_ENUM != gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_ENUM was not generated by DrawTransformFeedbackInstanced and "
											   "DrawTransformFeedbackStreamInstanced when <mode> was invalid."
											<< tcu::TestLog::EndMessage;
		return false;
	}

	gl.drawTransformFeedbackStreamInstanced(mode, m_transform_feedback_object_0, 0, 1);

	if (GL_INVALID_ENUM != gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_ENUM was not generated by DrawTransformFeedbackInstanced and "
											   "DrawTransformFeedbackStreamInstanced when <mode> was invalid."
											<< tcu::TestLog::EndMessage;
		return false;
	}

	/*  INVALID_OPERATION is generated by DrawTransformFeedbackInstanced and
	 DrawTransformFeedbackStreamInstanced if <mode> does not match geometry
	 shader */

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transform_feedback_object_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback call failed.");

	gl.useProgram(m_program_id_with_geometry_shader);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vertex_array_object);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.beginTransformFeedback(GL_POINTS);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	gl.drawTransformFeedbackInstanced(GL_LINES, m_transform_feedback_object_0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;
		return false;
	}

	gl.drawTransformFeedbackStreamInstanced(GL_LINES, m_transform_feedback_object_0, 0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;
		return false;
	}

	/*  INVALID_OPERATION is generated by DrawTransformFeedbackInstanced and
	 DrawTransformFeedbackStreamInstanced if <mode> does not match tessellation */

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transform_feedback_object_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback call failed.");

	gl.useProgram(m_program_id_with_tessellation_shaders);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vertex_array_object);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.beginTransformFeedback(GL_LINES);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_PATCHES, 0, 2);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	gl.drawTransformFeedbackInstanced(GL_POINTS, m_transform_feedback_object_0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;
		return false;
	}

	gl.drawTransformFeedbackStreamInstanced(GL_POINTS, m_transform_feedback_object_0, 0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;
		return false;
	}

	/*  INVALID_VALUE is generated by DrawTransformFeedbackStreamInstanced if
	 <stream> is greater than or equal to MAX_VERTEX_STREAMS */

	glw::GLint max_vertex_streams = 0;

	gl.getIntegerv(GL_MAX_VERTEX_STREAMS, &max_vertex_streams);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (max_vertex_streams == 0)
	{
		/* Failed to query GL_MAX_VERTEX_STREAMS. */
		throw 0;
	}

	glw::GLint more_than_max_vertex_streams = max_vertex_streams + 1;

	gl.drawTransformFeedbackStreamInstanced(GL_PATCHES, m_transform_feedback_object_0, more_than_max_vertex_streams, 1);

	if (GL_INVALID_VALUE != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;
		return false;
	}

	/*  INVALID_VALUE is generated by DrawTransformFeedbackInstanced and
	 DrawTransformFeedbackStreamInstanced if <id> is not name of transform
	 feedback object */

	unsigned short int invalid_name = 1;

	while (gl.isTransformFeedback(invalid_name))
	{
		++invalid_name;

		/* Make sure that this loop ends someday, bad day. */
		if (invalid_name == USHRT_MAX)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Cannot find unused trnasform feedback object." << tcu::TestLog::EndMessage;
			throw 0;
		}
	}

	gl.drawTransformFeedbackInstanced(GL_PATCHES, (glw::GLuint)invalid_name, 1);

	if (GL_INVALID_VALUE != gl.getError())
	{
		gl.endTransformFeedback();

		return false;
	}

	gl.drawTransformFeedbackStreamInstanced(GL_PATCHES, (glw::GLuint)invalid_name, 0, 1);

	if (GL_INVALID_VALUE != gl.getError())
	{
		gl.endTransformFeedback();

		return false;
	}

	/*  INVALID_OPERATION is generated by DrawTransformFeedbackInstanced and
	 DrawTransformFeedbackStreamInstanced if a non-zero buffer object name is
	 bound to an enabled array and the buffer object's data store is currently
	 mapped */

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transform_feedback_object_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback call failed.");

	gl.useProgram(m_program_id_with_input_output);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vertex_array_object);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer_1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	glw::GLint location = gl.getAttribLocation(m_program_id_with_input_output, (glw::GLchar*)"v_input");

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetAttribLocation call failed.");

	if (location < 0)
	{
		throw 0;
	}

	gl.vertexAttribPointer(location, 1, GL_FLOAT, GL_FALSE, 0, NULL);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribLPointer call failed.");

	gl.enableVertexAttribArray(0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase call failed.");

	gl.beginTransformFeedback(GL_POINTS);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	glw::GLvoid* pointer UNUSED = gl.mapBuffer(GL_ARRAY_BUFFER, GL_READ_WRITE);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	gl.drawTransformFeedbackInstanced(GL_POINTS, m_transform_feedback_object_0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

		gl.disableVertexAttribArray(location);

		return false;
	}

	gl.drawTransformFeedbackStreamInstanced(GL_POINTS, m_transform_feedback_object_0, 0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

		gl.disableVertexAttribArray(location);

		return false;
	}

	gl.unmapBuffer(GL_ARRAY_BUFFER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	pointer = DE_NULL;

	gl.disableVertexAttribArray(location);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisableVertexAttribArray call failed.");

	/*  INVALID_OPERATION is generated if by DrawTransformFeedbackStreamInstanced
	 if EndTransformFeedback was never called for the object named <id>.
	 return true */

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transform_feedback_object_1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback call failed.");

	gl.drawTransformFeedbackStreamInstanced(GL_PATCHES, m_transform_feedback_object_1, 0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

		gl.disableVertexAttribArray(location);

		return false;
	}

	return true;
}